

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O1

void server::aiman::calcteams(vector<teamscore> *teams)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  teamscore *ptVar5;
  teamscore local_40;
  
  if (0 < DAT_00194834) {
    lVar4 = 0;
    do {
      lVar1 = *(long *)(clients + lVar4 * 8);
      if ((*(int *)(lVar1 + 0x3c4) != 5) && (*(char *)(lVar1 + 0x124) != '\0')) {
        lVar3 = (long)teams->ulen;
        if (0 < lVar3) {
          ptVar5 = teams->buf;
          do {
            iVar2 = strcmp(ptVar5->team,(char *)(lVar1 + 0x124));
            if (iVar2 == 0) goto LAB_00144416;
            ptVar5 = ptVar5 + 1;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        ptVar5 = (teamscore *)0x0;
LAB_00144416:
        if (ptVar5 == (teamscore *)0x0) {
          local_40.score = 1;
          local_40.team = (char *)(lVar1 + 0x124);
          vector<teamscore>::add(teams,&local_40);
        }
        else {
          ptVar5->score = ptVar5->score + 1;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < DAT_00194834);
  }
  quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>
            (teams->buf,teams->buf + teams->ulen,teamscore::compare);
  if (teams->ulen < 2) {
    lVar4 = 0;
    do {
      iVar2 = vector<teamscore>::htfind<char_const*>
                        (teams,(char **)((long)autoteam::teamnames + lVar4));
      if (iVar2 < 0) {
        local_40.team = *(char **)((long)autoteam::teamnames + lVar4);
        local_40.score = 0;
        vector<teamscore>::add(teams,&local_40);
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 == 8);
  }
  return;
}

Assistant:

void calcteams(vector<teamscore> &teams)
    {
        static const char * const defaults[2] = { "good", "evil" };
        loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(ci->state.state==CS_SPECTATOR || !ci->team[0]) continue;
            teamscore *t = NULL;
            loopvj(teams) if(!strcmp(teams[j].team, ci->team)) { t = &teams[j]; break; }
            if(t) t->score++;
            else teams.add(teamscore(ci->team, 1));
        }
        teams.sort(teamscore::compare);
        if(teams.length() < int(sizeof(defaults)/sizeof(defaults[0])))
        {
            loopi(sizeof(defaults)/sizeof(defaults[0])) if(teams.htfind(defaults[i]) < 0) teams.add(teamscore(defaults[i], 0));
        }
    }